

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O3

socket_t sock_connect(uint32_t ip,int port)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  vw_exception *pvVar7;
  ulong uVar8;
  bool bVar9;
  sockaddr_in far_end;
  char dotted_quad [16];
  char __errmsg [256];
  char servInfo [32];
  stringstream __msg;
  char __errmsg_2 [256];
  sockaddr local_798;
  char local_788 [16];
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  stringstream local_6f8;
  undefined7 uStack_6f7;
  long local_6f0;
  ostream local_6e8;
  char local_568 [32];
  stringstream local_548 [16];
  undefined1 local_538 [1024];
  char local_138 [264];
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    std::__cxx11::stringstream::stringstream(local_548);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,"socket",6);
    piVar5 = __errno_location();
    pcVar2 = (char *)&local_6f8;
    pcVar6 = strerror_r(*piVar5,pcVar2,0x100);
    if (pcVar6 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,"errno = ",8);
      sVar3 = strlen(pcVar2);
    }
    else {
      sVar3 = 0xf;
      pcVar2 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,pcVar2,sVar3);
    pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x26,&local_718);
    __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_798.sa_family = 2;
  local_798.sa_data[6] = '\0';
  local_798.sa_data[7] = '\0';
  local_798.sa_data[8] = '\0';
  local_798.sa_data[9] = '\0';
  local_798.sa_data[10] = '\0';
  local_798.sa_data[0xb] = '\0';
  local_798.sa_data[0xc] = '\0';
  local_798.sa_data[0xd] = '\0';
  local_798.sa_data._0_2_ = (short)port;
  local_798.sa_data._2_4_ = ip;
  pcVar2 = inet_ntop(2,local_798.sa_data + 2,local_788,0x10);
  if (pcVar2 != (char *)0x0) {
    iVar1 = getnameinfo(&local_798,0x10,(char *)local_548,0x401,local_568,0x20,2);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(&local_6f8);
      std::__ostream_insert<char,std::char_traits<char>>(&local_6e8,"getnameinfo(",0xc);
      sVar3 = strlen(local_788);
      std::__ostream_insert<char,std::char_traits<char>>(&local_6e8,local_788,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(&local_6e8,")",1);
      piVar5 = __errno_location();
      pcVar2 = local_138;
      pcVar6 = strerror_r(*piVar5,pcVar2,0x100);
      if (pcVar6 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(&local_6e8,"errno = ",8);
        sVar3 = strlen(pcVar2);
      }
      else {
        sVar3 = 0xf;
        pcVar2 = "errno = unknown";
      }
      std::__ostream_insert<char,std::char_traits<char>>(&local_6e8,pcVar2,sVar3);
      pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                 ,0x37,&local_758);
      __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"connecting to ",0xe);
    sVar3 = strlen(local_788);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_788,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," = ",3);
    sVar3 = strlen((char *)local_548);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_548,sVar3);
    local_6f8 = (stringstream)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_6f8,1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar1 = connect(__fd,&local_798,0x10);
    if (iVar1 == -1) {
      uVar8 = 0;
      do {
        std::__cxx11::stringstream::stringstream(local_548);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_538,"connect attempt ",0x10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_538);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," failed: ",9);
        piVar5 = __errno_location();
        pcVar2 = strerror(*piVar5);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
        }
        std::__cxx11::stringbuf::str();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)CONCAT71(uStack_6f7,local_6f8),local_6f0);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((ostream *)CONCAT71(uStack_6f7,local_6f8) != &local_6e8) {
          operator_delete((ostream *)CONCAT71(uStack_6f7,local_6f8));
        }
        sleep(1);
        std::__cxx11::stringstream::~stringstream(local_548);
        std::ios_base::~ios_base((ios_base *)(local_538 + 0x70));
        iVar1 = connect(__fd,&local_798,0x10);
      } while ((iVar1 == -1) && (bVar9 = uVar8 < 99, uVar8 = uVar8 + 1, bVar9));
      if (iVar1 == -1) {
        std::__cxx11::stringstream::stringstream(local_548);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_538,"cannot connect",0xe);
        pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                   ,0x4b,&local_778);
        __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    return __fd;
  }
  std::__cxx11::stringstream::stringstream(local_548);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,"inet_ntop",9);
  piVar5 = __errno_location();
  pcVar2 = (char *)&local_6f8;
  pcVar6 = strerror_r(*piVar5,pcVar2,0x100);
  if (pcVar6 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,"errno = ",8);
    sVar3 = strlen(pcVar2);
  }
  else {
    sVar3 = 0xf;
    pcVar2 = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,pcVar2,sVar3);
  pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0x32,&local_738);
  __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

socket_t sock_connect(const uint32_t ip, const int port)
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = port;

  far_end.sin_addr = *(in_addr*)&ip;
  memset(&far_end.sin_zero, '\0', 8);

  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, &(far_end.sin_addr), dotted_quad, INET_ADDRSTRLEN))
      THROWERRNO("inet_ntop");

    char hostname[NI_MAXHOST];
    char servInfo[NI_MAXSERV];
    if (getnameinfo((sockaddr*)&far_end, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV, NI_NUMERICSERV))
      THROWERRNO("getnameinfo(" << dotted_quad << ")");

    cerr << "connecting to " << dotted_quad << " = " << hostname << ':' << ntohs(port) << endl;
  }

  size_t count = 0;
  int ret;
  while ((ret = connect(sock, (sockaddr*)&far_end, sizeof(far_end))) == -1 && count < 100)
  {
    count++;
    stringstream msg;
    msg << "connect attempt " << count << " failed: " << strerror(errno);
    cerr << msg.str() << endl;
#ifdef _WIN32
    Sleep(1);
#else
    sleep(1);
#endif
  }
  if (ret == -1)
    THROW("cannot connect");
  return sock;
}